

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRt4RevSubClampPalCommand::Execute
          (DrawColumnRt4RevSubClampPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  byte *pbVar14;
  long lVar15;
  
  iVar9 = (this->super_PalRtCommand).yl;
  iVar9 = DrawerThread::count_for_thread(thread,iVar9,((this->super_PalRtCommand).yh - iVar9) + 1);
  if (0 < iVar9) {
    puVar4 = (this->super_PalRtCommand)._srcblend;
    puVar5 = (this->super_PalRtCommand)._destblend;
    iVar1 = (this->super_PalRtCommand).yl;
    iVar10 = DrawerThread::skipped_by_thread(thread,iVar1);
    iVar2 = (this->super_PalRtCommand).sx;
    iVar1 = (&ylookup)[iVar10 + iVar1];
    puVar6 = (this->super_PalRtCommand)._destorg;
    puVar7 = thread->dc_temp;
    iVar11 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    iVar11 = iVar11 << 2;
    iVar10 = thread->num_cores;
    iVar3 = (this->super_PalRtCommand)._pitch;
    puVar8 = (this->super_PalRtCommand)._colormap;
    pbVar14 = puVar6 + (long)(iVar2 + iVar1) + 3;
    lVar15 = 0;
    do {
      uVar12 = (puVar5[pbVar14[-3]] | 0x40100400) -
               puVar4[puVar8[puVar7[lVar15 * 4 + (long)iVar11]]];
      uVar13 = uVar12 & 0x40100400;
      uVar12 = uVar13 - (uVar13 >> 5) & uVar12 | 0x1f07c1f;
      pbVar14[-3] = RGB32k.All[uVar12 >> 0xf & uVar12];
      uVar12 = (puVar5[pbVar14[-2]] | 0x40100400) -
               puVar4[puVar8[puVar7[lVar15 * 4 + (long)iVar11 + 1]]];
      uVar13 = uVar12 & 0x40100400;
      uVar12 = uVar13 - (uVar13 >> 5) & uVar12 | 0x1f07c1f;
      pbVar14[-2] = RGB32k.All[uVar12 >> 0xf & uVar12];
      uVar12 = (puVar5[pbVar14[-1]] | 0x40100400) -
               puVar4[puVar8[puVar7[lVar15 * 4 + (long)iVar11 + 2]]];
      uVar13 = uVar12 & 0x40100400;
      uVar12 = uVar13 - (uVar13 >> 5) & uVar12 | 0x1f07c1f;
      pbVar14[-1] = RGB32k.All[uVar12 >> 0xf & uVar12];
      uVar12 = (puVar5[*pbVar14] | 0x40100400) -
               puVar4[puVar8[puVar7[lVar15 * 4 + (long)iVar11 + 3]]];
      uVar13 = uVar12 & 0x40100400;
      uVar12 = uVar13 - (uVar13 >> 5) & uVar12 | 0x1f07c1f;
      *pbVar14 = RGB32k.All[uVar12 >> 0xf & uVar12];
      lVar15 = lVar15 + 1;
      pbVar14 = pbVar14 + iVar10 * iVar3;
    } while (iVar9 != (int)lVar15);
  }
  return;
}

Assistant:

void DrawColumnRt4RevSubClampPalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		const uint32_t *fg2rgb = _srcblend;
		const uint32_t *bg2rgb = _destblend;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch * thread->num_cores;
		colormap = _colormap;

		do {
			uint32_t a = (bg2rgb[dest[0]] | 0x40100400) - fg2rgb[colormap[source[0]]];
			uint32_t b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[0] = RGB32k.All[(a>>15) & a];

			a = (bg2rgb[dest[1]] | 0x40100400) - fg2rgb[colormap[source[1]]];
			b = a;
			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[1] = RGB32k.All[(a>>15) & a];

			a = (bg2rgb[dest[2]] | 0x40100400) - fg2rgb[colormap[source[2]]];
			b = a;
			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[2] = RGB32k.All[(a>>15) & a];

			a = (bg2rgb[dest[3]] | 0x40100400) - fg2rgb[colormap[source[3]]];
			b = a;
			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[3] = RGB32k.All[(a>>15) & a];

			source += 4;
			dest += pitch;
		} while (--count);
	}